

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTable.c
# Opt level: O2

void Hop_TableInsert(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  uint uVar1;
  ulong uVar2;
  Hop_Obj_t *pHVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t **ppHVar5;
  Hop_Obj_t *pHVar6;
  Hop_Obj_t **ppHVar7;
  uint uVar8;
  ulong uVar9;
  int iVar11;
  ulong uVar12;
  char *__assertion;
  timespec local_40;
  ulong uVar10;
  
  if (((ulong)pObj & 1) == 0) {
    pHVar4 = Hop_TableLookup(p,pObj);
    if (pHVar4 == (Hop_Obj_t *)0x0) {
      if (((char)pObj->Id == '\0') && (p->nTableSize * 2 < p->nObjs[5] + p->nObjs[4])) {
        clock_gettime(3,&local_40);
        ppHVar7 = p->pTable;
        uVar1 = p->nTableSize;
        uVar9 = (ulong)((p->nObjs[5] + p->nObjs[4]) * 2 - 1);
LAB_0065eca4:
        do {
          uVar8 = (int)uVar9 + 1;
          uVar10 = (ulong)uVar8;
          uVar12 = uVar9 & 1;
          uVar9 = uVar10;
        } while (uVar12 != 0);
        uVar12 = 3;
LAB_0065ecaf:
        iVar11 = (int)uVar12;
        if ((uint)(iVar11 * iVar11) <= uVar8) goto code_r0x0065ecb8;
        p->nTableSize = uVar8;
        ppHVar5 = (Hop_Obj_t **)calloc(1,(long)(int)uVar8 << 3);
        p->pTable = ppHVar5;
        uVar12 = 0;
        uVar9 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar9 = uVar12;
        }
        iVar11 = 0;
        for (; uVar12 != uVar9; uVar12 = uVar12 + 1) {
          pHVar4 = ppHVar7[uVar12];
          if (pHVar4 != (Hop_Obj_t *)0x0) goto LAB_0065ed37;
          pHVar3 = (Hop_Obj_t *)0x0;
          while (pHVar6 = pHVar3, pHVar4 != (Hop_Obj_t *)0x0) {
            ppHVar5 = Hop_TableFind(p,pHVar4);
            if (*ppHVar5 != (Hop_Obj_t *)0x0) {
              __assert_fail("*ppPlace == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                            ,0xbb,"void Hop_TableResize(Hop_Man_t *)");
            }
            *ppHVar5 = pHVar4;
            (pHVar4->field_1).pNext = (Hop_Obj_t *)0x0;
            iVar11 = iVar11 + 1;
            pHVar3 = (Hop_Obj_t *)0x0;
            pHVar4 = pHVar6;
            if (pHVar6 != (Hop_Obj_t *)0x0) {
LAB_0065ed37:
              pHVar3 = (pHVar4->field_1).pNext;
            }
          }
        }
        if (iVar11 != p->nObjs[5] + p->nObjs[4]) {
          __assert_fail("Counter == nEntries",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                        ,0xc2,"void Hop_TableResize(Hop_Man_t *)");
        }
        free(ppHVar7);
      }
      ppHVar7 = Hop_TableFind(p,pObj);
      if (*ppHVar7 == (Hop_Obj_t *)0x0) {
        *ppHVar7 = pObj;
        return;
      }
      __assertion = "*ppPlace == NULL";
      uVar1 = 0x6c;
    }
    else {
      __assertion = "Hop_TableLookup(p, pObj) == NULL";
      uVar1 = 0x68;
    }
  }
  else {
    __assertion = "!Hop_IsComplement(pObj)";
    uVar1 = 0x67;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                ,uVar1,"void Hop_TableInsert(Hop_Man_t *, Hop_Obj_t *)");
code_r0x0065ecb8:
  uVar2 = uVar10 % uVar12;
  uVar12 = (ulong)(iVar11 + 2);
  if ((int)uVar2 == 0) goto LAB_0065eca4;
  goto LAB_0065ecaf;
}

Assistant:

void Hop_TableInsert( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    Hop_Obj_t ** ppPlace;
    assert( !Hop_IsComplement(pObj) );
    assert( Hop_TableLookup(p, pObj) == NULL );
    if ( (pObj->Id & 0xFF) == 0 && 2 * p->nTableSize < Hop_ManNodeNum(p) )
        Hop_TableResize( p );
    ppPlace = Hop_TableFind( p, pObj );
    assert( *ppPlace == NULL );
    *ppPlace = pObj;
}